

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmailClientSendInBlue.cpp
# Opt level: O1

ssize_t __thiscall
EmailClientSendInBlue::send(EmailClientSendInBlue *this,int __fd,void *__buf,size_t __n,int __flags)

{
  CaseInsensitiveMultimap *pCVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ostream *poVar3;
  string_view content;
  string body;
  shared_ptr<SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Response>
  r2;
  CaseInsensitiveMultimap header;
  Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> client;
  string local_210;
  undefined1 local_1f0 [32];
  undefined1 local_1d0 [16];
  _Alloc_hider *local_1c0 [2];
  _Alloc_hider local_1b0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined4 local_180;
  _Alloc_hider local_178;
  __node_base_ptr p_Stack_170;
  Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> local_168;
  
  local_1a0._8_8_ = 0;
  local_190._M_allocated_capacity = local_190._M_allocated_capacity & 0xffffffffffffff00;
  pCVar1 = (CaseInsensitiveMultimap *)(local_1f0 + 0x10);
  local_1f0._8_8_ = (char *)0x0;
  local_1f0[0x10] = '\0';
  paVar2 = &local_210.field_2;
  local_210._M_string_length = 0;
  local_210.field_2._M_local_buf[0] = '\0';
  local_210._M_dataplus._M_p = (pointer)paVar2;
  local_1f0._0_8_ = pCVar1;
  local_1a0._M_allocated_capacity = (size_type)&local_190;
  SimpleWeb::Client<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::Client
            (&local_168,&this->url_,true,(string *)&local_1a0,(string *)local_1f0,&local_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar2) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  if ((CaseInsensitiveMultimap *)local_1f0._0_8_ != pCVar1) {
    operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_allocated_capacity != &local_190) {
    operator_delete((void *)local_1a0._M_allocated_capacity,local_190._M_allocated_capacity + 1);
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::dump((string_t *)local_1f0,&this->body_,-1,' ',false,strict);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Send email request: ",0x14);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_1f0._0_8_,local_1f0._8_8_);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  local_1a0._M_allocated_capacity = (size_type)&p_Stack_170;
  local_1a0._8_8_ = 1;
  local_190._M_allocated_capacity = 0;
  local_190._8_8_ = 0;
  local_180._0_1_ = false;
  local_180._1_3_ = 0x3f8000;
  local_178._M_p = (pointer)0x0;
  p_Stack_170 = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<char_const(&)[13],char_const(&)[17]>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&local_1a0,0,"Content-Type","application/json");
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
  ::_M_emplace<char_const(&)[8],std::__cxx11::string_const&>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,SimpleWeb::CaseInsensitiveEqual,SimpleWeb::CaseInsensitiveHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,false>>
              *)&local_1a0,0,"api-key",&this->apiKey_);
  local_210._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_210,"POST","");
  local_1c0[0] = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"/v3/smtp/email","");
  content._M_str = (char *)local_1f0._8_8_;
  content._M_len = (size_t)local_1c0;
  SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::request
            ((ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_> *)local_1d0,
             (string *)&local_168,&local_210,content,(CaseInsensitiveMultimap *)local_1f0._0_8_);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0],(ulong)(local_1b0[0]._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar2) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Response:",9);
  SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>>>::Content::
  string_abi_cxx11_(&local_210,(Content *)(local_1d0._0_8_ + 0xa0));
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_210._M_dataplus._M_p,local_210._M_string_length);
  std::ios::widen((char)poVar3->_vptr_basic_ostream[-3] + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar2) {
    operator_delete(local_210._M_dataplus._M_p,
                    CONCAT71(local_210.field_2._M_allocated_capacity._1_7_,
                             local_210.field_2._M_local_buf[0]) + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_SimpleWeb::CaseInsensitiveEqual,_SimpleWeb::CaseInsensitiveHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_SimpleWeb::CaseInsensitiveEqual,_SimpleWeb::CaseInsensitiveHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_false>_>
                 *)&local_1a0);
  if ((CaseInsensitiveMultimap *)local_1f0._0_8_ != pCVar1) {
    operator_delete((void *)local_1f0._0_8_,CONCAT71(local_1f0._17_7_,local_1f0[0x10]) + 1);
  }
  local_168.super_ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>.
  _vptr_ClientBase = (_func_int **)&PTR__Client_001ab218;
  asio::ssl::context::~context(&local_168.context);
  SimpleWeb::ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>::~ClientBase
            (&local_168.
              super_ClientBase<asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp>_>_>);
  return CONCAT71((int7)((ulong)poVar3 >> 8),1) & 0xffffffff;
}

Assistant:

bool EmailClientSendInBlue::send()
{
    SimpleWeb::Client<SimpleWeb::HTTPS> client(url_, true);

    // Synchronous request examples
    std::string body = body_.dump();

    std::cout << "Send email request: " << body << std::endl;

    try {
        SimpleWeb::CaseInsensitiveMultimap header;
        header.emplace("Content-Type", "application/json");
        header.emplace("api-key", apiKey_ );

        auto r2 = client.request("POST", "/v3/smtp/email", body, header);
        std::cout << "Response:" << r2->content.string() << std::endl;
    }
    catch(const SimpleWeb::system_error &e) {
        std::cerr << "Client request error: " << e.what() << std::endl;
        return false;
    }

    return true;
}